

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void CountUniqueBoardPositions<ttt::Board>(int depth)

{
  Board *this;
  size_type sVar1;
  pointer plVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  __node_base_ptr *pp_Var8;
  uint uVar9;
  __node_base *p_Var10;
  pointer plVar11;
  int local_138;
  Board ng;
  size_t local_108;
  long m;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  unique_hashes;
  vector<long,_std::allocator<long>_> moves;
  unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
  sets [2];
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Game size: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5," bytes\n");
  lVar6 = 0x70;
  pp_Var8 = &sets[0]._M_h._M_single_bucket;
  do {
    ((_Hashtable *)(pp_Var8 + -6))->_M_buckets = pp_Var8;
    pp_Var8[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var8 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var8[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var8 + -2))->_M_max_load_factor = 1.0;
    pp_Var8[-1] = (__node_base_ptr)0x0;
    *pp_Var8 = (__node_base_ptr)0x0;
    pp_Var8 = pp_Var8 + 7;
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != 0);
  ttt::Board::Board((Board *)&unique_hashes);
  std::__detail::
  _Insert_base<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::insert<ttt::Board_const*>
            ((_Insert_base<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)sets,(Board *)&unique_hashes,
             (Board *)((long)&unique_hashes._M_h._M_bucket_count + 2));
  local_138 = 0;
  if (depth < 1) {
    depth = 0;
  }
  uVar9 = 0;
  while (local_138 != depth) {
    unique_hashes._M_h._M_buckets = &unique_hashes._M_h._M_single_bucket;
    unique_hashes._M_h._M_bucket_count = 1;
    unique_hashes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    unique_hashes._M_h._M_element_count = 0;
    unique_hashes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    unique_hashes._M_h._M_rehash_policy._M_next_resize = 0;
    unique_hashes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    poVar5 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    local_138 = local_138 + 1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_138);
    std::operator<<(poVar5,'\n');
    uVar3 = 1 - uVar9;
    std::
    _Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&sets[uVar3]._M_h);
    lVar6 = std::chrono::_V2::system_clock::now();
    p_Var10 = &sets[uVar9]._M_h._M_before_begin;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      this = (Board *)(p_Var10 + 1);
      iVar4 = ttt::Board::GetStatus(this);
      if (iVar4 == -1) {
        ttt::Board::GetPossibleMoves(&moves,this);
        plVar2 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (plVar11 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start; plVar11 != plVar2; plVar11 = plVar11 + 1) {
          m = *plVar11;
          ng._8_2_ = *(undefined2 *)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor;
          ng.board._M_elems._0_8_ = *(undefined8 *)(this->board)._M_elems;
          ttt::Board::ApplyMove(&ng,&m);
          std::
          _Hashtable<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<ttt::Board&>
                    ((_Hashtable<ttt::Board,ttt::Board,std::allocator<ttt::Board>,std::__detail::_Identity,std::equal_to<ttt::Board>,std::hash<ttt::Board>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&sets[uVar3]._M_h,&ng);
          local_108 = ttt::Board::Hash(&ng);
          std::
          _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_emplace<unsigned_long>(&unique_hashes._M_h,&local_108);
        }
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&moves.super__Vector_base<long,_std::allocator<long>_>);
      }
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    poVar5 = std::operator<<((ostream *)&std::cout,"Current depth hash count: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," / ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5," = ");
    sVar1 = sets[uVar3]._M_h._M_element_count;
    poVar5 = std::ostream::_M_insert<double>
                       (((((double)CONCAT44(0x45300000,
                                            (int)(unique_hashes._M_h._M_element_count >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)unique_hashes._M_h._M_element_count) -
                         4503599627370496.0)) * 100.0) /
                        (((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25
                         ) + ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)));
    std::operator<<(poVar5,"%\n");
    poVar5 = std::operator<<((ostream *)&std::cout,"Current depth node count: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,", size: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"MB\n");
    poVar5 = std::operator<<((ostream *)&std::cout,"Current depth duration  : ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," seconds ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::operator<<(poVar5," milliseconds, ");
    sVar1 = sets[uVar3]._M_h._M_element_count;
    poVar5 = std::ostream::_M_insert<double>
                       (((((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                        (double)((lVar7 - lVar6) / 1000000)) * 1000.0);
    std::operator<<(poVar5," nps\n");
    poVar5 = std::operator<<((ostream *)&std::cout,"Total count             : ");
    poVar5 = std::ostream::_M_insert<long_long>((longlong)poVar5);
    std::operator<<(poVar5,'\n');
    std::
    _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&unique_hashes._M_h);
    uVar9 = uVar3;
  }
  lVar6 = 0x38;
  do {
    std::
    _Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<ttt::Board,_ttt::Board,_std::allocator<ttt::Board>,_std::__detail::_Identity,_std::equal_to<ttt::Board>,_std::hash<ttt::Board>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)((long)&sets[0]._M_h._M_buckets + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x38);
  return;
}

Assistant:

void
CountUniqueBoardPositions(int depth)
{
    std::cout << "Game size: " << sizeof(IGame) << " bytes\n";
    long long total = 1;
    std::unordered_set<IGame> sets[2];
    sets[0].insert({{}});
    int set_ind = 0;
    for (int i = 0; i < depth; ++i)
    {
        std::unordered_set<long long> unique_hashes;
        std::cout << "Working on depth: " << i + 1 << '\n';
        sets[1 - set_ind].clear();
        auto t1 = std::chrono::high_resolution_clock::now();
        for (const auto &g : sets[set_ind])
        {
            if (g.GetStatus() != game::Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                sets[1 - set_ind].emplace(ng);
                unique_hashes.emplace(ng.Hash());
            }
        }
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        total += sets[1 - set_ind].size();
        std::cout << "Current depth hash count: " << unique_hashes.size() << " / " << sets[1 - set_ind].size() << " = " << double(unique_hashes.size()) * 100.0 / sets[1 - set_ind].size() << "%\n";
        std::cout << "Current depth node count: " << sets[1 - set_ind].size() << ", size: " << sets[1 - set_ind].size() * sizeof(IGame) / (1 << 20) << "MB\n";
        std::cout << "Current depth duration  : " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds, " << double(sets[1 - set_ind].size()) / millis * 1000 << " nps\n";
        std::cout << "Total count             : " << total << '\n';
        set_ind = 1 - set_ind;
    }
}